

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# glsVertexArrayTests.cpp
# Opt level: O0

char * deqp::gls::RandomArrayGenerator::createQuads<deqp::gls::GLValue::WrappedType<signed_char>>
                 (int seed,int count,int componentCount,int offset,int stride,Primitive primitive,
                 WrappedType<signed_char> min,WrappedType<signed_char> max,float gridSize)

{
  bool bVar1;
  WrappedType<signed_char> WVar2;
  char *pcVar3;
  int iVar4;
  float fVar5;
  float fVar6;
  int local_98;
  int i_1;
  int i;
  WrappedType<signed_char> local_7c;
  char local_7b;
  char local_7a;
  char local_79;
  WrappedType<signed_char> local_78;
  char local_77;
  char local_76;
  char local_75;
  Byte local_74;
  WrappedType<signed_char> local_73;
  char local_72;
  char local_71;
  char local_70;
  WrappedType<signed_char> local_6f;
  char local_6e;
  char local_6d;
  char local_6c;
  Byte local_6b;
  WrappedType<signed_char> local_6a;
  char local_69;
  char local_68;
  char local_67;
  WrappedType<signed_char> local_66;
  char local_65;
  int local_64;
  WrappedType<signed_char> local_5e;
  WrappedType<signed_char> local_5d;
  int attemptNdx;
  WrappedType<signed_char> w;
  int iStack_58;
  WrappedType<signed_char> z;
  WrappedType<signed_char> y2;
  WrappedType<signed_char> y1;
  WrappedType<signed_char> x2;
  WrappedType<signed_char> x1;
  int quadNdx;
  WrappedType<signed_char> minDiff;
  WrappedType<signed_char> minQuadSize;
  deRandom rnd;
  char *_data;
  char *resultData;
  int quadStride;
  int componentStride;
  float gridSize_local;
  Primitive primitive_local;
  int stride_local;
  int offset_local;
  int componentCount_local;
  int count_local;
  int seed_local;
  WrappedType<signed_char> max_local;
  WrappedType<signed_char> min_local;
  
  count_local._3_1_ = min.m_value;
  count_local._2_1_ = max.m_value;
  resultData._0_4_ = 0;
  gridSize_local = (float)stride;
  if (stride == 0) {
    gridSize_local = (float)componentCount;
  }
  if (primitive == PRIMITIVE_TRIANGLES) {
    resultData._0_4_ = (int)gridSize_local * 6;
  }
  pcVar3 = (char *)operator_new__((long)(offset + (int)resultData * count));
  deRandom_init((deRandom *)&quadNdx,seed);
  if (primitive == PRIMITIVE_TRIANGLES) {
    fVar5 = gls::GLValue::WrappedType<signed_char>::to<float>
                      ((WrappedType<signed_char> *)((long)&count_local + 2));
    fVar6 = gls::GLValue::WrappedType<signed_char>::to<float>
                      ((WrappedType<signed_char> *)((long)&count_local + 3));
    fVar5 = deFloatAbs(fVar5 - fVar6);
    x1 = gls::GLValue::WrappedType<signed_char>::fromFloat(fVar5 * gridSize);
    y1.m_value = (char)minValue<deqp::gls::GLValue::WrappedType<signed_char>>();
    bVar1 = gls::GLValue::WrappedType<signed_char>::operator>(&y1,&x1);
    if (bVar1) {
      x2.m_value = (char)minValue<deqp::gls::GLValue::WrappedType<signed_char>>();
    }
    else {
      x2 = x1;
    }
    for (iStack_58 = 0; iStack_58 < count; iStack_58 = iStack_58 + 1) {
      for (local_64 = 0; local_64 < 4; local_64 = local_64 + 1) {
        local_67 = count_local._3_1_;
        local_68 = count_local._2_1_;
        local_66.m_value =
             (char)getRandom<deqp::gls::GLValue::WrappedType<signed_char>>
                             ((deRandom *)&quadNdx,count_local._3_1_,count_local._2_1_);
        local_65 = (char)roundTo<deqp::gls::GLValue::WrappedType<signed_char>>(&x2,&local_66);
        local_6b.m_value = x2.m_value;
        attemptNdx._3_1_ = (WrappedType<signed_char>)local_65;
        local_6d = (char)gls::GLValue::WrappedType<signed_char>::operator-
                                   ((WrappedType<signed_char> *)((long)&count_local + 2),
                                    (WrappedType<signed_char> *)((long)&attemptNdx + 3));
        local_6c = (char)abs<deqp::gls::GLValue::WrappedType<signed_char>>((Byte)local_6d);
        local_6a.m_value =
             (char)getRandom<deqp::gls::GLValue::WrappedType<signed_char>>
                             ((deRandom *)&quadNdx,local_6b,(Byte)local_6c);
        local_69 = (char)roundTo<deqp::gls::GLValue::WrappedType<signed_char>>(&x2,&local_6a);
        local_70 = count_local._3_1_;
        local_71 = count_local._2_1_;
        attemptNdx._2_1_ = (WrappedType<signed_char>)local_69;
        local_6f.m_value =
             (char)getRandom<deqp::gls::GLValue::WrappedType<signed_char>>
                             ((deRandom *)&quadNdx,count_local._3_1_,count_local._2_1_);
        local_6e = (char)roundTo<deqp::gls::GLValue::WrappedType<signed_char>>(&x2,&local_6f);
        local_74.m_value = x2.m_value;
        attemptNdx._1_1_ = (WrappedType<signed_char>)local_6e;
        local_76 = (char)gls::GLValue::WrappedType<signed_char>::operator-
                                   ((WrappedType<signed_char> *)((long)&count_local + 2),
                                    (WrappedType<signed_char> *)((long)&attemptNdx + 1));
        local_75 = (char)abs<deqp::gls::GLValue::WrappedType<signed_char>>((Byte)local_76);
        local_73.m_value =
             (char)getRandom<deqp::gls::GLValue::WrappedType<signed_char>>
                             ((deRandom *)&quadNdx,local_74,(Byte)local_75);
        local_72 = (char)roundTo<deqp::gls::GLValue::WrappedType<signed_char>>(&x2,&local_73);
        attemptNdx._0_1_ = (WrappedType<signed_char>)local_72;
        if (componentCount < 3) {
          local_77 = (char)gls::GLValue::WrappedType<signed_char>::create('\0');
        }
        else {
          local_79 = count_local._3_1_;
          local_7a = count_local._2_1_;
          local_78.m_value =
               (char)getRandom<deqp::gls::GLValue::WrappedType<signed_char>>
                               ((deRandom *)&quadNdx,count_local._3_1_,count_local._2_1_);
          local_77 = (char)roundTo<deqp::gls::GLValue::WrappedType<signed_char>>(&x2,&local_78);
        }
        local_5d.m_value = local_77;
        if (componentCount < 4) {
          local_7b = (char)gls::GLValue::WrappedType<signed_char>::create('\x01');
        }
        else {
          local_7c.m_value =
               (char)getRandom<deqp::gls::GLValue::WrappedType<signed_char>>
                               ((deRandom *)&quadNdx,count_local._3_1_,count_local._2_1_);
          local_7b = (char)roundTo<deqp::gls::GLValue::WrappedType<signed_char>>(&x2,&local_7c);
        }
        local_5e.m_value = local_7b;
        if (componentCount < 3) break;
        fVar5 = gls::GLValue::WrappedType<signed_char>::to<float>
                          ((WrappedType<signed_char> *)((long)&attemptNdx + 2));
        fVar6 = gls::GLValue::WrappedType<signed_char>::to<float>(&local_5d);
        fVar5 = deFloatAbs(fVar5 + fVar6);
        fVar6 = gls::GLValue::WrappedType<signed_char>::to<float>(&x2);
        if (fVar6 <= fVar5) {
          fVar5 = gls::GLValue::WrappedType<signed_char>::to<float>
                            ((WrappedType<signed_char> *)&attemptNdx);
          fVar6 = gls::GLValue::WrappedType<signed_char>::to<float>(&local_5e);
          fVar5 = deFloatAbs(fVar5 + fVar6);
          fVar6 = gls::GLValue::WrappedType<signed_char>::to<float>(&x2);
          if (fVar6 <= fVar5) break;
        }
      }
      alignmentSafeAssignment<deqp::gls::GLValue::WrappedType<signed_char>>
                (pcVar3 + (long)(iStack_58 * (int)resultData) + (long)offset,attemptNdx._3_1_);
      alignmentSafeAssignment<deqp::gls::GLValue::WrappedType<signed_char>>
                (pcVar3 + (long)(iStack_58 * (int)resultData + 1) + (long)offset,attemptNdx._1_1_);
      iVar4 = iStack_58 * (int)resultData;
      WVar2 = gls::GLValue::WrappedType<signed_char>::operator+
                        ((WrappedType<signed_char> *)((long)&attemptNdx + 3),
                         (WrappedType<signed_char> *)((long)&attemptNdx + 2));
      alignmentSafeAssignment<deqp::gls::GLValue::WrappedType<signed_char>>
                (pcVar3 + (long)(iVar4 + (int)gridSize_local) + (long)offset,WVar2);
      alignmentSafeAssignment<deqp::gls::GLValue::WrappedType<signed_char>>
                (pcVar3 + (long)(iStack_58 * (int)resultData + (int)gridSize_local + 1) +
                          (long)offset,attemptNdx._1_1_);
      alignmentSafeAssignment<deqp::gls::GLValue::WrappedType<signed_char>>
                (pcVar3 + (long)(iStack_58 * (int)resultData + (int)gridSize_local * 2) +
                          (long)offset,attemptNdx._3_1_);
      iVar4 = iStack_58 * (int)resultData;
      WVar2 = gls::GLValue::WrappedType<signed_char>::operator+
                        ((WrappedType<signed_char> *)((long)&attemptNdx + 1),
                         (WrappedType<signed_char> *)&attemptNdx);
      alignmentSafeAssignment<deqp::gls::GLValue::WrappedType<signed_char>>
                (pcVar3 + (long)(iVar4 + (int)gridSize_local * 2 + 1) + (long)offset,WVar2);
      alignmentSafeAssignment<deqp::gls::GLValue::WrappedType<signed_char>>
                (pcVar3 + (long)(iStack_58 * (int)resultData + (int)gridSize_local * 3) +
                          (long)offset,attemptNdx._3_1_);
      iVar4 = iStack_58 * (int)resultData;
      WVar2 = gls::GLValue::WrappedType<signed_char>::operator+
                        ((WrappedType<signed_char> *)((long)&attemptNdx + 1),
                         (WrappedType<signed_char> *)&attemptNdx);
      alignmentSafeAssignment<deqp::gls::GLValue::WrappedType<signed_char>>
                (pcVar3 + (long)(iVar4 + (int)gridSize_local * 3 + 1) + (long)offset,WVar2);
      iVar4 = iStack_58 * (int)resultData;
      WVar2 = gls::GLValue::WrappedType<signed_char>::operator+
                        ((WrappedType<signed_char> *)((long)&attemptNdx + 3),
                         (WrappedType<signed_char> *)((long)&attemptNdx + 2));
      alignmentSafeAssignment<deqp::gls::GLValue::WrappedType<signed_char>>
                (pcVar3 + (long)(iVar4 + (int)gridSize_local * 4) + (long)offset,WVar2);
      alignmentSafeAssignment<deqp::gls::GLValue::WrappedType<signed_char>>
                (pcVar3 + (long)(iStack_58 * (int)resultData + (int)gridSize_local * 4 + 1) +
                          (long)offset,attemptNdx._1_1_);
      iVar4 = iStack_58 * (int)resultData;
      WVar2 = gls::GLValue::WrappedType<signed_char>::operator+
                        ((WrappedType<signed_char> *)((long)&attemptNdx + 3),
                         (WrappedType<signed_char> *)((long)&attemptNdx + 2));
      alignmentSafeAssignment<deqp::gls::GLValue::WrappedType<signed_char>>
                (pcVar3 + (long)(iVar4 + (int)gridSize_local * 5) + (long)offset,WVar2);
      iVar4 = iStack_58 * (int)resultData;
      WVar2 = gls::GLValue::WrappedType<signed_char>::operator+
                        ((WrappedType<signed_char> *)((long)&attemptNdx + 1),
                         (WrappedType<signed_char> *)&attemptNdx);
      alignmentSafeAssignment<deqp::gls::GLValue::WrappedType<signed_char>>
                (pcVar3 + (long)(iVar4 + (int)gridSize_local * 5 + 1) + (long)offset,WVar2);
      if (2 < componentCount) {
        for (i_1 = 0; i_1 < 6; i_1 = i_1 + 1) {
          alignmentSafeAssignment<deqp::gls::GLValue::WrappedType<signed_char>>
                    (pcVar3 + (long)(iStack_58 * (int)resultData + (int)gridSize_local * i_1 + 2) +
                              (long)offset,local_5d);
        }
      }
      if (3 < componentCount) {
        for (local_98 = 0; local_98 < 6; local_98 = local_98 + 1) {
          alignmentSafeAssignment<deqp::gls::GLValue::WrappedType<signed_char>>
                    (pcVar3 + (long)(iStack_58 * (int)resultData + (int)gridSize_local * local_98 +
                                    3) + (long)offset,local_5e);
        }
      }
    }
  }
  return pcVar3;
}

Assistant:

char* RandomArrayGenerator::createQuads (int seed, int count, int componentCount, int offset, int stride, Array::Primitive primitive, T min, T max, float gridSize)
{
	int componentStride = sizeof(T);
	int quadStride = 0;

	if (stride == 0)
		stride = componentCount * componentStride;

	DE_ASSERT(stride >= componentCount * componentStride);

	switch (primitive)
	{
		case Array::PRIMITIVE_TRIANGLES:
			quadStride = stride * 6;
			break;

		default:
			DE_ASSERT(false);
			break;
	}

	char* resultData = new char[offset + quadStride * count];
	char* _data = resultData;
	resultData = resultData + offset;

	deRandom rnd;
	deRandom_init(&rnd,  seed);

	switch (primitive)
	{
		case Array::PRIMITIVE_TRIANGLES:
		{
			const T	minQuadSize	= T::fromFloat(deFloatAbs(max.template to<float>() - min.template to<float>()) * gridSize);
			const T	minDiff		= minValue<T>() > minQuadSize
								? minValue<T>()
								: minQuadSize;

			for (int quadNdx = 0; quadNdx < count; ++quadNdx)
			{
				T x1, x2;
				T y1, y2;
				T z, w;

				// attempt to find a good (i.e not extremely small) quad
				for (int attemptNdx = 0; attemptNdx < 4; ++attemptNdx)
				{
					x1 = roundTo(minDiff, getRandom<T>(rnd, min, max));
					x2 = roundTo(minDiff, getRandom<T>(rnd, minDiff, abs<T>(max - x1)));

					y1 = roundTo(minDiff, getRandom<T>(rnd, min, max));
					y2 = roundTo(minDiff, getRandom<T>(rnd, minDiff, abs<T>(max - y1)));

					z = (componentCount > 2) ? roundTo(minDiff, (getRandom<T>(rnd, min, max))) : (T::create(0));
					w = (componentCount > 3) ? roundTo(minDiff, (getRandom<T>(rnd, min, max))) : (T::create(1));

					// no additional components, all is good
					if (componentCount <= 2)
						break;

					// The result quad is too thin?
					if ((deFloatAbs(x2.template to<float>() + z.template to<float>()) < minDiff.template to<float>()) ||
						(deFloatAbs(y2.template to<float>() + w.template to<float>()) < minDiff.template to<float>()))
						continue;

					// all ok
					break;
				}

				alignmentSafeAssignment<T>(&(resultData[quadNdx * quadStride]), x1);
				alignmentSafeAssignment<T>(&(resultData[quadNdx * quadStride + componentStride]), y1);

				alignmentSafeAssignment<T>(&(resultData[quadNdx * quadStride + stride]), x1 + x2);
				alignmentSafeAssignment<T>(&(resultData[quadNdx * quadStride + stride + componentStride]), y1);

				alignmentSafeAssignment<T>(&(resultData[quadNdx * quadStride + stride * 2]), x1);
				alignmentSafeAssignment<T>(&(resultData[quadNdx * quadStride + stride * 2 + componentStride]), y1 + y2);

				alignmentSafeAssignment<T>(&(resultData[quadNdx * quadStride + stride * 3]), x1);
				alignmentSafeAssignment<T>(&(resultData[quadNdx * quadStride + stride * 3 + componentStride]), y1 + y2);

				alignmentSafeAssignment<T>(&(resultData[quadNdx * quadStride + stride * 4]), x1 + x2);
				alignmentSafeAssignment<T>(&(resultData[quadNdx * quadStride + stride * 4 + componentStride]), y1);

				alignmentSafeAssignment<T>(&(resultData[quadNdx * quadStride + stride * 5]), x1 + x2);
				alignmentSafeAssignment<T>(&(resultData[quadNdx * quadStride + stride * 5 + componentStride]), y1 + y2);

				if (componentCount > 2)
				{
					for (int i = 0; i < 6; i++)
						alignmentSafeAssignment<T>(&(resultData[quadNdx * quadStride + stride * i + componentStride * 2]), z);
				}

				if (componentCount > 3)
				{
					for (int i = 0; i < 6; i++)
						alignmentSafeAssignment<T>(&(resultData[quadNdx * quadStride + stride * i + componentStride * 3]), w);
				}
			}

			break;
		}

		default:
			DE_ASSERT(false);
			break;
	}

	return _data;
}